

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O2

_Bool borg_allow_teleport(void)

{
  _Bool _Var1;
  
  if ((player->upkeep->arena_level == false) &&
     (_Var1 = square_isno_teleport(cave,(loc)borg.c), !_Var1)) {
    return borg.trait[0xac] == 0;
  }
  return false;
}

Assistant:

bool borg_allow_teleport(void)
{
    /* No teleporting in arena levels */
    if (player->upkeep->arena_level)
        return false;

    /* Check for a no teleport grid */
    if (square_isno_teleport(cave, borg.c))
        return false;

    /* Check for a no teleport curse */
    if (borg.trait[BI_CRSNOTEL])
        return false;

    return true;
}